

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::mutate(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  Index IVar4;
  Expression *pEVar5;
  Block *expr;
  Drop *left;
  Block *pBVar6;
  Expression *item;
  ulong in_RCX;
  Expression ***pppEVar7;
  Type type;
  TranslateToFuzzReader *pTVar8;
  Builder *this_00;
  MixedArena *this_01;
  Index index;
  optional<wasm::Type> type_00;
  Literal local_a0;
  undefined1 local_88 [8];
  ChildIterator children;
  
  uVar2 = Random::upTo((Random *)(*(long *)((long)this + 0xd8) + 0x18),100);
  if ((uVar2 < *(uint *)((long)this + 0xe0)) &&
     (bVar1 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xd8),curr), bVar1))
  {
    uVar2 = Random::upTo((Random *)(*(long *)((long)this + 0xd8) + 0x18),100);
    if (((int)uVar2 < 5) && (*(char *)((long)this + 0xe4) != '\0')) {
      pTVar8 = *(TranslateToFuzzReader **)((long)this + 0xd8);
      type.id = 1;
LAB_0014417b:
      pEVar5 = make(pTVar8,type);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,pEVar5);
      return;
    }
    if (curr->_id == ConstId) {
      if (0x31 < (int)uVar2) {
        pTVar8 = *(TranslateToFuzzReader **)((long)this + 0xd8);
        type.id = (curr->type).id;
        goto LAB_0014417b;
      }
      pTVar8 = *(TranslateToFuzzReader **)((long)this + 0xd8);
      wasm::Literal::Literal(&local_a0,(Literal *)(curr + 1));
      tweak((Literal *)local_88,pTVar8,&local_a0);
      wasm::Literal::operator=((Literal *)(curr + 1),(Literal *)local_88);
      wasm::Literal::~Literal((Literal *)local_88);
      wasm::Literal::~Literal(&local_a0);
    }
    else {
      expr = (Block *)make(*(TranslateToFuzzReader **)((long)this + 0xd8),(Type)(curr->type).id);
      if (((int)uVar2 < 0x21) &&
         ((expr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 0))
      {
        if (((uVar2 & 1) == 0) || (bVar1 = replaceChildWith((Expression *)expr,curr), !bVar1)) {
          this_00 = (Builder *)(*(long *)((long)this + 0xd8) + 0x10);
          left = Builder::makeDrop(this_00,curr);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
          expr = Builder::makeSequence(this_00,(Expression *)left,(Expression *)expr,type_00);
        }
      }
      else if ((0x41 < (int)uVar2) &&
              ((0x35 < (ulong)curr->_id ||
               ((0x3000000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)))) {
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                  ((AbstractChildIterator<wasm::ChildIterator> *)local_88,curr);
        if (((int)((ulong)((long)children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                 flexible.
                                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                          (long)children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                fixed._M_elems[3]) >> 3) + local_88._0_4_) - 1U < 4) {
          this_01 = (MixedArena *)(*(long *)(*(long *)((long)this + 0xd8) + 0x10) + 0x200);
          pBVar6 = (Block *)MixedArena::allocSpace(this_01,0x40,8);
          (pBVar6->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId
          ;
          (pBVar6->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
          (pBVar6->name).super_IString.str._M_len = 0;
          (pBVar6->name).super_IString.str._M_str = (char *)0x0;
          (pBVar6->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          data = (Expression **)0x0;
          (pBVar6->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements = 0;
          (pBVar6->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          allocatedElements = 0;
          (pBVar6->list).allocator = this_01;
          uVar3 = (int)((ulong)((long)children.super_AbstractChildIterator<wasm::ChildIterator>.
                                      children.flexible.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start -
                               (long)children.super_AbstractChildIterator<wasm::ChildIterator>.
                                     children.fixed._M_elems[3]) >> 3) + local_88._0_4_;
          children.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar3;
          if (uVar3 != 0) {
            index = 0;
            do {
              IVar4 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                                ((AbstractChildIterator<wasm::ChildIterator> *)local_88,index);
              pppEVar7 = (Expression ***)
                         (children.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3] + ((ulong)IVar4 - 4));
              if (IVar4 < 4) {
                pppEVar7 = children.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                           _M_elems + ((ulong)IVar4 - 1);
              }
              pEVar5 = **pppEVar7;
              bVar1 = replaceChildWith((Expression *)expr,pEVar5);
              if (!bVar1) {
                item = (Expression *)
                       MixedArena::allocSpace
                                 ((MixedArena *)
                                  (*(long *)(*(long *)((long)this + 0xd8) + 0x10) + 0x200),0x18,8);
                item->_id = DropId;
                (item->type).id = 0;
                *(Expression **)(item + 1) = pEVar5;
                wasm::Drop::finalize();
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          (&(pBVar6->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,item);
              }
              index = index + 1;
            } while ((Index)children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage != index);
          }
          if ((pBVar6->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements != 0) {
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&(pBVar6->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (Expression *)expr);
            wasm::Block::finalize(pBVar6);
            expr = pBVar6;
          }
        }
        if (children.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3] !=
            (Expression **)0x0) {
          operator_delete(children.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3],
                          (long)children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)children.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                fixed._M_elems[3]);
        }
      }
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,
                 (Expression *)expr);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.upTo(100) < percentChance &&
          parent.canBeArbitrarilyReplaced(curr)) {
        // We can replace in various modes, see below. Generate a random number
        // up to 100 to help us there.
        int mode = parent.upTo(100);

        if (allowUnreachable && mode < 5) {
          replaceCurrent(parent.make(Type::unreachable));
          return;
        }

        // For constants, perform only a small tweaking in some cases.
        // TODO: more minor tweaks to immediates, like making a load atomic or
        // not, changing an offset, etc.
        if (auto* c = curr->dynCast<Const>()) {
          if (mode < 50) {
            c->value = parent.tweak(c->value);
          } else {
            // Just replace the entire thing.
            replaceCurrent(parent.make(curr->type));
          }
          return;
        }

        // Generate a replacement for the expression, and by default replace all
        // of |curr| (including children) with that replacement, but in some
        // cases we can do more subtle things.
        //
        // Note that such a replacement is not always valid due to nesting of
        // labels, but we'll fix that up later. Note also that make() picks a
        // subtype, so this has a chance to replace us with anything that is
        // valid to put here.
        auto* rep = parent.make(curr->type);
        if (mode < 33 && rep->type != Type::none) {
          // This has a non-none type. Replace the output, keeping the
          // expression and its children in a drop. This "interposes" between
          // this expression and its parent, something like this:
          //
          //    (D
          //      (A
          //        (B)
          //        (C)
          //      )
          //    )
          ////
          //    => ;; keep A, replace it in the parent
          //
          //    (D
          //      (block
          //        (drop
          //          (A
          //            (B)
          //            (C)
          //          )
          //        )
          //        (NEW)
          //      )
          //    )
          //
          // We also sometimes try to insert A as a child of NEW, so we actually
          // interpose directly:
          //
          //    (D
          //      (NEW
          //        (A
          //          (B)
          //          (C)
          //        )
          //      )
          //    )
          //
          // We do not do that all the time, as inserting a drop is actually an
          // important situation to test: the drop makes the output of A unused,
          // which may let optimizations remove it.
          if ((mode & 1) && replaceChildWith(rep, curr)) {
            // We managed to replace one of the children with curr, and have
            // nothing more to do.
          } else {
            // Drop curr and append.
            rep =
              parent.builder.makeSequence(parent.builder.makeDrop(curr), rep);
          }
        } else if (mode >= 66 && !Properties::isControlFlowStructure(curr)) {
          ChildIterator children(curr);
          auto numChildren = children.getNumChildren();
          if (numChildren > 0 && numChildren < 5) {
            // This is a normal (non-control-flow) expression with at least one
            // child (and not an excessive amount of them; see the processing
            // below). "Interpose" between the children and this expression by
            // keeping them and replacing the parent |curr|. We do this by
            // generating drops of the children, like this:
            //
            //  (A
            //    (B)
            //    (C)
            //  )
            //
            //  => ;; keep children, replace A
            //
            //  (block
            //    (drop (B))
            //    (drop (C))
            //    (NEW)
            //  )
            //
            auto* block = parent.builder.makeBlock();
            for (auto* child : children) {
              // Only drop the child if we can't replace it as one of NEW's
              // children. This does a linear scan of |rep| which is the reason
              // for the above limit on the number of children.
              if (!replaceChildWith(rep, child)) {
                block->list.push_back(parent.builder.makeDrop(child));
              }
            }

            if (!block->list.empty()) {
              // We need the block, that is, we did not find a place for all the
              // children.
              block->list.push_back(rep);
              block->finalize();
              rep = block;
            }
          }
        }
        replaceCurrent(rep);
      }
    }